

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::update_progress
          (crn_comp *this,uint phase_index,uint subphase_index,uint subphase_total)

{
  crn_bool cVar1;
  uint subphase_total_local;
  uint subphase_index_local;
  uint phase_index_local;
  crn_comp *this_local;
  
  if (this->m_pParams->m_pProgress_func == (crn_progress_callback_func)0x0) {
    this_local._7_1_ = true;
  }
  else {
    cVar1 = (*this->m_pParams->m_pProgress_func)
                      (phase_index,0x19,subphase_index,subphase_total,
                       this->m_pParams->m_pProgress_func_data);
    this_local._7_1_ = cVar1 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool crn_comp::update_progress(uint phase_index, uint subphase_index, uint subphase_total) {
  if (!m_pParams->m_pProgress_func)
    return true;

#if CRNLIB_ENABLE_DEBUG_MESSAGES
  if (m_pParams->m_flags & cCRNCompFlagDebugging)
    return true;
#endif

  return (*m_pParams->m_pProgress_func)(phase_index, cTotalCompressionPhases, subphase_index, subphase_total, m_pParams->m_pProgress_func_data) != 0;
}